

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O1

void __thiscall bitdeque<32768>::erase_front(bitdeque<32768> *this,size_type n)

{
  long lVar1;
  bitset<32768UL> *this_00;
  iterator __last;
  ulong uVar2;
  _Elt_pointer pbVar3;
  long lVar4;
  _Map_pointer ppbVar5;
  _Elt_pointer pbVar6;
  difference_type __node_offset;
  ulong uVar7;
  long in_FS_OFFSET;
  iterator in_stack_ffffffffffffff78;
  _Map_pointer in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0x8000 - (long)this->m_pad_begin;
  uVar7 = n - uVar2;
  if (uVar2 <= n) {
    this->m_pad_begin = 0;
    pbVar6 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_cur;
    pbVar3 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_first;
    ppbVar5 = (this->m_deque).
              super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    lVar4 = ((long)pbVar6 - (long)pbVar3 >> 0xc) + 1;
    if (lVar4 == 0) {
      pbVar6 = pbVar6 + 1;
    }
    else {
      ppbVar5 = ppbVar5 + lVar4;
      pbVar3 = *ppbVar5;
      pbVar6 = pbVar3;
    }
    uVar2 = uVar7 >> 0xf;
    lVar4 = ((long)pbVar6 - (long)pbVar3 >> 0xc) + uVar2;
    if (lVar4 == 0) {
      pbVar6 = pbVar6 + uVar2;
    }
    else {
      ppbVar5 = ppbVar5 + lVar4;
      pbVar6 = *ppbVar5;
    }
    __last._M_first = pbVar6;
    __last._M_cur = (_Elt_pointer)in_stack_ffffffffffffff98;
    __last._M_last = *ppbVar5;
    __last._M_node = (_Map_pointer)(*ppbVar5 + 1);
    std::deque<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::_M_erase
              ((iterator *)&stack0xffffffffffffff80,&this->m_deque,in_stack_ffffffffffffff78,__last)
    ;
    n = (size_type)((uint)uVar7 & 0x7fff);
  }
  if (n != 0) {
    this_00 = (this->m_deque).
              super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    do {
      std::bitset<32768UL>::reset(this_00,(long)this->m_pad_begin);
      this->m_pad_begin = this->m_pad_begin + 1;
      n = n - 1;
    } while (n != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void erase_front(size_type n)
    {
        if (n >= static_cast<size_type>(BITS_PER_WORD - m_pad_begin)) {
            n -= BITS_PER_WORD - m_pad_begin;
            m_pad_begin = 0;
            m_deque.erase(m_deque.begin(), m_deque.begin() + 1 + (n / BITS_PER_WORD));
            n %= BITS_PER_WORD;
        }
        if (n) {
            auto& first = m_deque.front();
            while (n) {
                first.reset(m_pad_begin);
                ++m_pad_begin;
                --n;
            }
        }
    }